

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

char * resole_appdir_path(char *root_env_file_path)

{
  char *pcVar1;
  
  pcVar1 = getenv("APPDIR");
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  if (root_env_file_path != (char *)0x0) {
    pcVar1 = strrchr(root_env_file_path,0x2f);
    pcVar1 = strndup(root_env_file_path,(long)pcVar1 - (long)root_env_file_path);
    return pcVar1;
  }
  resole_appdir_path_cold_1();
  pcVar1 = realpath("/proc/self/exe",(char *)0x0);
  return pcVar1;
}

Assistant:

char *resole_appdir_path(const char *root_env_file_path) {
    char *appdir = getenv("APPDIR");
    if (appdir == NULL) {
        if (root_env_file_path != NULL) {
            char *idx = strrchr(root_env_file_path, '/');
            appdir = strndup(root_env_file_path, idx - root_env_file_path);
        } else {
            die("Could not resolve APPDIR\n");
        }
    }
    return appdir;
}